

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::parse_u16_array(CBS *cbs,Array<unsigned_short> *out)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  unsigned_short *out_00;
  ulong local_58;
  size_t i;
  undefined1 local_40 [8];
  Array<unsigned_short> ret;
  CBS copy;
  Array<unsigned_short> *out_local;
  CBS *cbs_local;
  
  ret.size_ = (size_t)cbs->data;
  sVar3 = CBS_len((CBS *)&ret.size_);
  if ((sVar3 & 1) == 0) {
    Array<unsigned_short>::Array((Array<unsigned_short> *)local_40);
    sVar3 = CBS_len((CBS *)&ret.size_);
    bVar1 = Array<unsigned_short>::InitForOverwrite((Array<unsigned_short> *)local_40,sVar3 >> 1);
    if (bVar1) {
      local_58 = 0;
      while( true ) {
        sVar3 = Array<unsigned_short>::size((Array<unsigned_short> *)local_40);
        if (sVar3 <= local_58) break;
        out_00 = Array<unsigned_short>::operator[]((Array<unsigned_short> *)local_40,local_58);
        iVar2 = CBS_get_u16((CBS *)&ret.size_,out_00);
        if (iVar2 == 0) {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x9fa);
          cbs_local._7_1_ = false;
          goto LAB_0016823c;
        }
        local_58 = local_58 + 1;
      }
      sVar3 = CBS_len((CBS *)&ret.size_);
      if (sVar3 != 0) {
        __assert_fail("CBS_len(&copy) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x9ff,"bool bssl::parse_u16_array(const CBS *, Array<uint16_t> *)");
      }
      Array<unsigned_short>::operator=(out,(Array<unsigned_short> *)local_40);
      cbs_local._7_1_ = true;
    }
    else {
      cbs_local._7_1_ = false;
    }
LAB_0016823c:
    Array<unsigned_short>::~Array((Array<unsigned_short> *)local_40);
  }
  else {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x9f0);
    cbs_local._7_1_ = false;
  }
  return cbs_local._7_1_;
}

Assistant:

static bool parse_u16_array(const CBS *cbs, Array<uint16_t> *out) {
  CBS copy = *cbs;
  if ((CBS_len(&copy) & 1) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  Array<uint16_t> ret;
  if (!ret.InitForOverwrite(CBS_len(&copy) / 2)) {
    return false;
  }
  for (size_t i = 0; i < ret.size(); i++) {
    if (!CBS_get_u16(&copy, &ret[i])) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  assert(CBS_len(&copy) == 0);
  *out = std::move(ret);
  return true;
}